

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

DOMNodeList * __thiscall
xercesc_4_0::DOMDocumentImpl::getDeepNodeList
          (DOMDocumentImpl *this,DOMNode *rootNode,XMLCh *tagName)

{
  DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *this_00;
  int iVar1;
  undefined4 extraout_var;
  DOMDeepNodeListPoolTableBucketElem<xercesc_4_0::DOMDeepNodeListImpl> *pDVar2;
  undefined4 extraout_var_00;
  XMLSize_t elemId;
  DOMDeepNodeListImpl *pDVar3;
  XMLSize_t hashVal;
  XMLSize_t local_30;
  
  if (this->fNodeListPool ==
      (DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *)0x0) {
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,0x40);
    DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::
    DOMDeepNodeListPool((DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>
                         *)CONCAT44(extraout_var,iVar1),0x6d,false,0x80);
    this->fNodeListPool =
         (DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *)
         CONCAT44(extraout_var,iVar1);
  }
  pDVar3 = (DOMDeepNodeListImpl *)0x0;
  pDVar2 = DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::
           findBucketElem(this->fNodeListPool,rootNode,tagName,(XMLCh *)0x0,&local_30);
  if (pDVar2 != (DOMDeepNodeListPoolTableBucketElem<xercesc_4_0::DOMDeepNodeListImpl> *)0x0) {
    pDVar3 = pDVar2->fData;
  }
  if (pDVar3 == (DOMDeepNodeListImpl *)0x0) {
    this_00 = this->fNodeListPool;
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,0x40);
    DOMDeepNodeListImpl::DOMDeepNodeListImpl
              ((DOMDeepNodeListImpl *)CONCAT44(extraout_var_00,iVar1),rootNode,tagName);
    elemId = DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::put
                       (this_00,rootNode,tagName,(XMLCh *)0x0,
                        (DOMDeepNodeListImpl *)CONCAT44(extraout_var_00,iVar1));
    pDVar3 = DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::getById
                       (this->fNodeListPool,elemId);
  }
  return &pDVar3->super_DOMNodeList;
}

Assistant:

DOMNodeList *DOMDocumentImpl::getDeepNodeList(const DOMNode *rootNode, const XMLCh *tagName)
{
    if(!fNodeListPool) {
        fNodeListPool = new (this) DOMDeepNodeListPool<DOMDeepNodeListImpl>(109, false);
    }

    DOMDeepNodeListImpl* retList = fNodeListPool->getByKey(rootNode, tagName, 0);
    if (!retList) {
        XMLSize_t id = fNodeListPool->put((void*) rootNode, (XMLCh*) tagName, 0, new (this) DOMDeepNodeListImpl(rootNode, tagName));
        retList = fNodeListPool->getById(id);
    }

    return retList;
}